

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix __thiscall Matrix::FromArray(Matrix *this,double *data,int rows,int cols)

{
  double *__dest;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  ulong uVar2;
  uint uVar3;
  Matrix MVar4;
  
  this->rows = rows;
  this->cols = cols;
  uVar3 = cols * rows;
  uVar2 = 0xffffffffffffffff;
  if (-1 < (int)uVar3) {
    uVar2 = (ulong)uVar3 * 8;
  }
  __dest = (double *)operator_new__(uVar2);
  this->data = __dest;
  uVar1 = extraout_RDX;
  if (uVar3 != 0) {
    memcpy(__dest,data,(long)(int)uVar3 << 3);
    uVar1 = extraout_RDX_00;
  }
  MVar4.rows = (int)uVar1;
  MVar4.cols = (int)((ulong)uVar1 >> 0x20);
  MVar4.data = (double *)this;
  return MVar4;
}

Assistant:

Matrix Matrix::FromArray(double* data, int rows, int cols)
{
    Matrix matrix(rows, cols);
    std::copy(data, data + rows * cols, matrix.data);

    return matrix;
}